

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O3

stbi_uc * stbi_png_load(char *filename,int *x,int *y,int *comp,int req_comp)

{
  FILE *__stream;
  uchar *puVar1;
  png pStack_68;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    puVar1 = (uchar *)0x0;
  }
  else {
    pStack_68.s.img_file = (FILE *)__stream;
    puVar1 = do_png(&pStack_68,x,y,comp,req_comp);
    fclose(__stream);
  }
  return puVar1;
}

Assistant:

unsigned char *stbi_png_load(char const *filename, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *data;
   FILE *f = fopen(filename, "rb");
   if (!f) return NULL;
   data = stbi_png_load_from_file(f,x,y,comp,req_comp);
   fclose(f);
   return data;
}